

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

bool __thiscall crnlib::crn_comp::create_comp_data(crn_comp *this)

{
  uint16 uVar1;
  uint uVar2;
  uint uVar3;
  crn_packed_uint<2U> *this_00;
  uchar *pBuf;
  vector<unsigned_char> *in_RDI;
  uint actual_header_size;
  uint i_1;
  crn_header *dst_header;
  uint i;
  uint level_ofs [16];
  void *in_stack_ffffffffffffff78;
  vector<unsigned_char> *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined1 grow_hint;
  uint in_stack_ffffffffffffff8c;
  vector<unsigned_char> *this_01;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint uVar4;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uint uVar5;
  uint auStack_48 [18];
  
  grow_hint = (undefined1)((uint)in_stack_ffffffffffffff88 >> 0x18);
  uVar2 = (uint)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  utils::zero_object<crnd::crn_header>((crn_header *)0x1d01d8);
  crnd::crn_packed_uint<2U>::operator=
            ((crn_packed_uint<2U> *)&in_RDI[0x155].m_capacity,
             *(uint *)(*(long *)&in_RDI[0x2c].m_size + 0xc) & 0xffff);
  crnd::crn_packed_uint<2U>::operator=
            ((crn_packed_uint<2U> *)((long)&in_RDI[0x155].m_capacity + 2),
             *(uint *)(*(long *)&in_RDI[0x2c].m_size + 0x10) & 0xffff);
  crnd::crn_packed_uint<1U>::operator=
            ((crn_packed_uint<1U> *)(in_RDI + 0x156),
             *(uint *)(*(long *)&in_RDI[0x2c].m_size + 0x14) & 0xff);
  crnd::crn_packed_uint<1U>::operator=
            ((crn_packed_uint<1U> *)((long)&in_RDI[0x156].m_p + 1),
             *(uint *)(*(long *)&in_RDI[0x2c].m_size + 8) & 0xff);
  crnd::crn_packed_uint<1U>::operator=
            ((crn_packed_uint<1U> *)((long)&in_RDI[0x156].m_p + 2),
             (uint)*(undefined8 *)(*(long *)&in_RDI[0x2c].m_size + 0x18) & 0xff);
  crnd::crn_packed_uint<4U>::operator=
            ((crn_packed_uint<4U> *)((long)&in_RDI[0x156].m_size + 1),
             *(uint *)(*(long *)&in_RDI[0x2c].m_size + 0x35c));
  crnd::crn_packed_uint<4U>::operator=
            ((crn_packed_uint<4U> *)((long)&in_RDI[0x156].m_capacity + 1),
             *(uint *)(*(long *)&in_RDI[0x2c].m_size + 0x360));
  vector<unsigned_char>::clear(in_stack_ffffffffffffff80);
  vector<unsigned_char>::reserve
            ((vector<unsigned_char> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             uVar2);
  append_vec(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0);
  this_01 = in_RDI + 0x15a;
  vector<unsigned_char>::size(in_RDI + 0x15a);
  vector<unsigned_char>::resize(this_01,in_stack_ffffffffffffff8c,(bool)grow_hint);
  uVar2 = vector<unsigned_char>::size(in_RDI + 0x211);
  if (uVar2 != 0) {
    uVar2 = vector<unsigned_int>::size((vector<unsigned_int> *)(in_RDI + 0x14f));
    crnd::crn_packed_uint<2U>::operator=
              ((crn_packed_uint<2U> *)((long)&in_RDI[0x157].m_p + 7),uVar2 & 0xffff);
    uVar2 = vector<unsigned_char>::size(in_RDI + 0x211);
    crnd::crn_packed_uint<3U>::operator=
              ((crn_packed_uint<3U> *)((long)&in_RDI[0x157].m_p + 4),uVar2);
    uVar2 = vector<unsigned_char>::size(in_RDI + 0x15a);
    crnd::crn_packed_uint<3U>::operator=
              ((crn_packed_uint<3U> *)((long)&in_RDI[0x157].m_p + 1),uVar2);
    append_vec((vector<unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_RDI);
  }
  uVar2 = vector<unsigned_char>::size(in_RDI + 0x212);
  if (uVar2 != 0) {
    uVar2 = vector<unsigned_int>::size((vector<unsigned_int> *)(in_RDI + 0x151));
    crnd::crn_packed_uint<2U>::operator=
              ((crn_packed_uint<2U> *)((long)&in_RDI[0x157].m_capacity + 3),uVar2 & 0xffff);
    uVar2 = vector<unsigned_char>::size(in_RDI + 0x212);
    crnd::crn_packed_uint<3U>::operator=((crn_packed_uint<3U> *)&in_RDI[0x157].m_capacity,uVar2);
    uVar2 = vector<unsigned_char>::size(in_RDI + 0x15a);
    crnd::crn_packed_uint<3U>::operator=
              ((crn_packed_uint<3U> *)((long)&in_RDI[0x157].m_size + 1),uVar2);
    append_vec((vector<unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_RDI);
  }
  uVar2 = vector<unsigned_char>::size(in_RDI + 0x213);
  if (uVar2 != 0) {
    uVar2 = vector<unsigned_int>::size((vector<unsigned_int> *)(in_RDI + 0x150));
    crnd::crn_packed_uint<2U>::operator=
              ((crn_packed_uint<2U> *)((long)&in_RDI[0x158].m_p + 7),uVar2 & 0xffff);
    uVar2 = vector<unsigned_char>::size(in_RDI + 0x213);
    crnd::crn_packed_uint<3U>::operator=
              ((crn_packed_uint<3U> *)((long)&in_RDI[0x158].m_p + 4),uVar2);
    uVar2 = vector<unsigned_char>::size(in_RDI + 0x15a);
    crnd::crn_packed_uint<3U>::operator=
              ((crn_packed_uint<3U> *)((long)&in_RDI[0x158].m_p + 1),uVar2);
    append_vec((vector<unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_RDI);
  }
  uVar2 = vector<unsigned_char>::size(in_RDI + 0x214);
  if (uVar2 != 0) {
    uVar2 = vector<unsigned_long_long>::size((vector<unsigned_long_long> *)(in_RDI + 0x152));
    crnd::crn_packed_uint<2U>::operator=
              ((crn_packed_uint<2U> *)((long)&in_RDI[0x158].m_capacity + 3),uVar2 & 0xffff);
    uVar2 = vector<unsigned_char>::size(in_RDI + 0x214);
    crnd::crn_packed_uint<3U>::operator=((crn_packed_uint<3U> *)&in_RDI[0x158].m_capacity,uVar2);
    uVar2 = vector<unsigned_char>::size(in_RDI + 0x15a);
    crnd::crn_packed_uint<3U>::operator=
              ((crn_packed_uint<3U> *)((long)&in_RDI[0x158].m_size + 1),uVar2);
    append_vec((vector<unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_RDI);
  }
  uVar2 = vector<unsigned_char>::size(in_RDI + 0x15a);
  crnd::crn_packed_uint<3U>::operator=((crn_packed_uint<3U> *)((long)&in_RDI[0x159].m_p + 3),uVar2);
  uVar2 = vector<unsigned_char>::size(in_RDI + 0x210);
  crnd::crn_packed_uint<2U>::operator=((crn_packed_uint<2U> *)((long)&in_RDI[0x159].m_p + 1),uVar2);
  append_vec((vector<unsigned_char> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_RDI);
  uVar5 = 0;
  while( true ) {
    uVar4 = uVar5;
    uVar2 = vector<crnlib::crn_comp::level_details>::size
                      ((vector<crnlib::crn_comp::level_details> *)&in_RDI[0x14d].m_size);
    if (uVar2 <= uVar5) break;
    uVar2 = vector<unsigned_char>::size(in_RDI + 0x15a);
    auStack_48[uVar4] = uVar2;
    append_vec((vector<unsigned_char> *)
               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),in_RDI);
    uVar5 = uVar4 + 1;
  }
  this_00 = (crn_packed_uint<2U> *)vector<unsigned_char>::operator[](in_RDI + 0x15a,0);
  memcpy(this_00,in_RDI + 0x155,0x4a);
  uVar5 = 0;
  while( true ) {
    uVar4 = uVar5;
    uVar2 = vector<crnlib::crn_comp::level_details>::size
                      ((vector<crnlib::crn_comp::level_details> *)&in_RDI[0x14d].m_size);
    if (uVar2 <= uVar5) break;
    crnd::crn_packed_uint<4U>::operator=
              ((crn_packed_uint<4U> *)(this_00 + (ulong)uVar4 * 2 + 0x23),auStack_48[uVar4]);
    uVar5 = uVar4 + 1;
  }
  uVar2 = vector<crnlib::crn_comp::level_details>::size
                    ((vector<crnlib::crn_comp::level_details> *)&in_RDI[0x14d].m_size);
  uVar2 = (uVar2 - 1) * 4 + 0x4a;
  crnd::crn_packed_uint<2U>::operator=(this_00,0x4878);
  uVar3 = vector<unsigned_char>::size(in_RDI + 0x15a);
  crnd::crn_packed_uint<4U>::operator=((crn_packed_uint<4U> *)(this_00 + 3),uVar3);
  pBuf = vector<unsigned_char>::operator[](in_RDI + 0x15a,uVar2);
  uVar3 = vector<unsigned_char>::size(in_RDI + 0x15a);
  uVar1 = crc16(pBuf,(ulong)(uVar3 - uVar2),0);
  crnd::crn_packed_uint<2U>::operator=(this_00 + 5,(uint)uVar1);
  crnd::crn_packed_uint<2U>::operator=(this_00 + 1,uVar2);
  uVar1 = crc16(this_00 + 3,(ulong)(uVar2 - 6),0);
  crnd::crn_packed_uint<2U>::operator=(this_00 + 2,(uint)uVar1);
  return true;
}

Assistant:

bool crn_comp::create_comp_data() {
  utils::zero_object(m_crn_header);

  m_crn_header.m_width = static_cast<uint16>(m_pParams->m_width);
  m_crn_header.m_height = static_cast<uint16>(m_pParams->m_height);
  m_crn_header.m_levels = static_cast<uint8>(m_pParams->m_levels);
  m_crn_header.m_faces = static_cast<uint8>(m_pParams->m_faces);
  m_crn_header.m_format = static_cast<uint8>(m_pParams->m_format);
  m_crn_header.m_userdata0 = m_pParams->m_userdata0;
  m_crn_header.m_userdata1 = m_pParams->m_userdata1;

  m_comp_data.clear();
  m_comp_data.reserve(2 * 1024 * 1024);
  append_vec(m_comp_data, &m_crn_header, sizeof(m_crn_header));
  // tack on the rest of the variable size m_level_ofs array
  m_comp_data.resize(m_comp_data.size() + sizeof(m_crn_header.m_level_ofs[0]) * (m_pParams->m_levels - 1));

  if (m_packed_color_endpoints.size()) {
    m_crn_header.m_color_endpoints.m_num = static_cast<uint16>(m_color_endpoints.size());
    m_crn_header.m_color_endpoints.m_size = m_packed_color_endpoints.size();
    m_crn_header.m_color_endpoints.m_ofs = m_comp_data.size();
    append_vec(m_comp_data, m_packed_color_endpoints);
  }

  if (m_packed_color_selectors.size()) {
    m_crn_header.m_color_selectors.m_num = static_cast<uint16>(m_color_selectors.size());
    m_crn_header.m_color_selectors.m_size = m_packed_color_selectors.size();
    m_crn_header.m_color_selectors.m_ofs = m_comp_data.size();
    append_vec(m_comp_data, m_packed_color_selectors);
  }

  if (m_packed_alpha_endpoints.size()) {
    m_crn_header.m_alpha_endpoints.m_num = static_cast<uint16>(m_alpha_endpoints.size());
    m_crn_header.m_alpha_endpoints.m_size = m_packed_alpha_endpoints.size();
    m_crn_header.m_alpha_endpoints.m_ofs = m_comp_data.size();
    append_vec(m_comp_data, m_packed_alpha_endpoints);
  }

  if (m_packed_alpha_selectors.size()) {
    m_crn_header.m_alpha_selectors.m_num = static_cast<uint16>(m_alpha_selectors.size());
    m_crn_header.m_alpha_selectors.m_size = m_packed_alpha_selectors.size();
    m_crn_header.m_alpha_selectors.m_ofs = m_comp_data.size();
    append_vec(m_comp_data, m_packed_alpha_selectors);
  }

  m_crn_header.m_tables_ofs = m_comp_data.size();
  m_crn_header.m_tables_size = m_packed_data_models.size();
  append_vec(m_comp_data, m_packed_data_models);

  uint level_ofs[cCRNMaxLevels];
  for (uint i = 0; i < m_levels.size(); i++) {
    level_ofs[i] = m_comp_data.size();
    append_vec(m_comp_data, m_packed_blocks[i]);
  }

  crnd::crn_header& dst_header = *(crnd::crn_header*)&m_comp_data[0];
  // don't change the m_comp_data vector - or dst_header will be invalidated!

  memcpy(&dst_header, &m_crn_header, sizeof(dst_header));

  for (uint i = 0; i < m_levels.size(); i++)
    dst_header.m_level_ofs[i] = level_ofs[i];

  const uint actual_header_size = sizeof(crnd::crn_header) + sizeof(dst_header.m_level_ofs[0]) * (m_levels.size() - 1);

  dst_header.m_sig = crnd::crn_header::cCRNSigValue;

  dst_header.m_data_size = m_comp_data.size();
  dst_header.m_data_crc16 = crc16(&m_comp_data[actual_header_size], m_comp_data.size() - actual_header_size);

  dst_header.m_header_size = actual_header_size;
  dst_header.m_header_crc16 = crc16(&dst_header.m_data_size, actual_header_size - (uint)((uint8*)&dst_header.m_data_size - (uint8*)&dst_header));

  return true;
}